

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O1

int v3_check_generic(char **value)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  
  pcVar6 = *value;
  sVar4 = strlen(pcVar6);
  if (3 < sVar4) {
    lVar5 = 4;
    iVar2 = strncmp(pcVar6,"DER:",4);
    if (iVar2 == 0) {
      iVar2 = 1;
      goto LAB_00225586;
    }
  }
  if (sVar4 < 5) {
    return 0;
  }
  lVar5 = 5;
  iVar2 = strncmp(pcVar6,"ASN1:",5);
  if (iVar2 != 0) {
    return 0;
  }
  iVar2 = 2;
LAB_00225586:
  pcVar6 = pcVar6 + lVar5 + -1;
  do {
    pbVar1 = (byte *)(pcVar6 + 1);
    pcVar6 = pcVar6 + 1;
    iVar3 = OPENSSL_isspace((uint)*pbVar1);
  } while (iVar3 != 0);
  *value = pcVar6;
  return iVar2;
}

Assistant:

static int v3_check_generic(const char **value) {
  int gen_type = 0;
  const char *p = *value;
  if ((strlen(p) >= 4) && !strncmp(p, "DER:", 4)) {
    p += 4;
    gen_type = 1;
  } else if ((strlen(p) >= 5) && !strncmp(p, "ASN1:", 5)) {
    p += 5;
    gen_type = 2;
  } else {
    return 0;
  }

  while (OPENSSL_isspace((unsigned char)*p)) {
    p++;
  }
  *value = p;
  return gen_type;
}